

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv_cpu_info(uv_cpu_info_t **ci,int *count)

{
  unsigned_long_long *puVar1;
  uv_cpu_info_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [12];
  uv_cpu_info_t **ppuVar8;
  int iVar9;
  int iVar10;
  FILE *pFVar11;
  char *pcVar12;
  size_t __n;
  uv_cpu_info_t *puVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  uint local_aa0;
  uint local_a9c;
  void *local_a98;
  int *local_a90;
  uv_cpu_info_t **local_a88;
  size_t local_a80;
  cpu t;
  unsigned_long_long skip;
  char buf [1024];
  char models [8] [64];
  uchar bitmap [1024];
  
  memset(bitmap,0,0x400);
  memset(models,0,0x200);
  builtin_strncpy(models[0],"unknown",8);
  local_a98 = uv__calloc(0x2000,0x38);
  iVar9 = -0xc;
  if (local_a98 != (void *)0x0) {
    pFVar11 = (FILE *)uv__open_file("/proc/stat");
    if (pFVar11 == (FILE *)0x0) {
      uv__free(local_a98);
      piVar14 = __errno_location();
      iVar9 = -*piVar14;
    }
    else {
      local_a90 = count;
      local_a88 = ci;
      pcVar12 = fgets(buf,0x400,pFVar11);
      if (pcVar12 == (char *)0x0) {
LAB_001bffc2:
        abort();
      }
      local_a9c = 0;
      while( true ) {
        t.idle = 0;
        t.irq = 0;
        t.nice = 0;
        t.sys = 0;
        t.freq = 0;
        t.user = 0;
        t.model = 0;
        t._52_4_ = 0;
        iVar9 = fscanf(pFVar11,"cpu%u %llu %llu %llu %llu %llu %llu",&local_aa0,&t.user,&t.nice,
                       &t.sys,&t.idle,&skip,&t.irq);
        if (iVar9 != 7) break;
        pcVar12 = fgets(buf,0x400,pFVar11);
        if (pcVar12 == (char *)0x0) goto LAB_001bffc2;
        if ((ulong)local_aa0 < 0x2000) {
          lVar15 = (ulong)local_aa0 * 0x38;
          *(undefined8 *)((long)local_a98 + lVar15 + 0x30) = t._48_8_;
          puVar1 = (unsigned_long_long *)((long)local_a98 + lVar15 + 0x20);
          *puVar1 = t.idle;
          puVar1[1] = t.irq;
          puVar1 = (unsigned_long_long *)((long)local_a98 + lVar15 + 0x10);
          *puVar1 = t.nice;
          puVar1[1] = t.sys;
          *(unsigned_long_long *)((long)local_a98 + lVar15) = t.freq;
          ((unsigned_long_long *)((long)local_a98 + lVar15))[1] = t.user;
          bitmap[local_aa0 >> 3] = bitmap[local_aa0 >> 3] | (byte)(1 << ((byte)local_aa0 & 7));
          if (local_a9c <= local_aa0) {
            local_a9c = local_aa0 + 1;
          }
        }
      }
      fclose(pFVar11);
      pFVar11 = (FILE *)uv__open_file("/proc/cpuinfo");
      if (pFVar11 != (FILE *)0x0) {
LAB_001bfce1:
        iVar9 = fscanf(pFVar11,"processor\t: %u\n",&local_aa0);
        if (iVar9 == 1) {
          do {
            pcVar12 = fgets(buf,0x400,pFVar11);
            if (pcVar12 == (char *)0x0) goto LAB_001bfdce;
            iVar9 = bcmp(buf,"model name\t: ",0xd);
          } while (iVar9 != 0);
          local_a80 = strcspn(buf + 0xd,"\n");
          bVar19 = true;
          iVar9 = 0;
          for (uVar18 = 0; (pcVar12 = models[0] + uVar18, bVar19 && (uVar18 < 0x200));
              uVar18 = uVar18 + 0x40) {
            __n = strlen(pcVar12);
            iVar10 = strncmp(buf + 0xd,pcVar12,__n);
            bVar19 = iVar10 != 0;
            iVar9 = iVar9 + 1;
          }
          if (!bVar19) {
            if (*pcVar12 == '\0') {
              snprintf(pcVar12,0x40,"%.*s",local_a80,buf + 0xd);
            }
            if (local_aa0 < local_a9c) {
              *(int *)((long)local_a98 + (ulong)local_aa0 * 0x38 + 0x30) = iVar9;
            }
          }
LAB_001bfdce:
          do {
            pcVar12 = fgets(buf,0x400,pFVar11);
            if (pcVar12 == (char *)0x0) break;
          } while (buf[0] != '\n');
          goto LAB_001bfce1;
        }
        fclose(pFVar11);
      }
      iVar9 = 0;
      uVar18 = 0;
      while (local_aa0 = (uint)uVar18, local_aa0 < local_a9c) {
        if ((bitmap[uVar18 >> 3] >> (local_aa0 & 7) & 1) != 0) {
          iVar9 = iVar9 + 1;
          snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq");
          pFVar11 = (FILE *)uv__open_file(buf);
          if (pFVar11 != (FILE *)0x0) {
            iVar10 = fscanf(pFVar11,"%llu",(void *)((ulong)local_aa0 * 0x38 + (long)local_a98));
            if (iVar10 != 1) goto LAB_001bffc2;
            fclose(pFVar11);
          }
        }
        uVar18 = (ulong)(local_aa0 + 1);
      }
      puVar13 = (uv_cpu_info_t *)uv__malloc((ulong)(iVar9 * 0x38 + 0x200));
      ppuVar8 = local_a88;
      *local_a88 = puVar13;
      *local_a90 = 0;
      if (*local_a88 == (uv_cpu_info_t *)0x0) {
        uv__free(local_a98);
        iVar9 = -0xc;
      }
      else {
        *local_a90 = iVar9;
        puVar13 = *local_a88;
        memcpy(puVar13 + iVar9,models,0x200);
        uVar18 = 0;
        for (local_aa0 = 0; local_aa0 < local_a9c; local_aa0 = local_aa0 + 1) {
          uVar16 = uVar18;
          if ((bitmap[local_aa0 >> 3] >> (local_aa0 & 7) & 1) != 0) {
            lVar17 = (ulong)local_aa0 * 0x38;
            puVar2 = *ppuVar8;
            uVar16 = (ulong)((int)uVar18 + 1);
            auVar7._8_4_ = 0;
            auVar7._0_8_ = *(ulong *)((long)local_a98 + lVar17);
            lVar15 = *(long *)((long)local_a98 + lVar17 + 8);
            lVar3 = *(long *)((long)local_a98 + lVar17 + 0x10);
            lVar4 = *(long *)((long)local_a98 + lVar17 + 0x18);
            lVar5 = *(long *)((long)local_a98 + lVar17 + 0x20);
            lVar6 = *(long *)((long)local_a98 + lVar17 + 0x28);
            puVar2[uVar18].model =
                 (char *)((ulong)*(uint *)((long)local_a98 + lVar17 + 0x30) * 0x40 +
                         (long)(puVar13 + iVar9));
            puVar2[uVar18].speed = SUB124(auVar7 / ZEXT812(1000),0);
            puVar2[uVar18].cpu_times.user = lVar15 * 10;
            puVar2[uVar18].cpu_times.nice = lVar3 * 10;
            puVar2[uVar18].cpu_times.sys = lVar4 * 10;
            puVar2[uVar18].cpu_times.idle = lVar5 * 10;
            puVar2[uVar18].cpu_times.irq = lVar6 * 10;
          }
          uVar18 = uVar16;
        }
        uv__free(local_a98);
        iVar9 = 0;
      }
    }
  }
  return iVar9;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** ci, int* count) {
#if defined(__PPC__)
  static const char model_marker[] = "cpu\t\t: ";
#elif defined(__arm__)
  static const char model_marker[] = "Processor\t: ";
#elif defined(__aarch64__)
  static const char model_marker[] = "CPU part\t: ";
#elif defined(__mips__)
  static const char model_marker[] = "cpu model\t\t: ";
#elif defined(__loongarch__)
  static const char model_marker[] = "cpu family\t\t: ";
#else
  static const char model_marker[] = "model name\t: ";
#endif
  static const char parts[] =
#ifdef __aarch64__
    "0x811\nARM810\n"       "0x920\nARM920\n"      "0x922\nARM922\n"
    "0x926\nARM926\n"       "0x940\nARM940\n"      "0x946\nARM946\n"
    "0x966\nARM966\n"       "0xa20\nARM1020\n"      "0xa22\nARM1022\n"
    "0xa26\nARM1026\n"      "0xb02\nARM11 MPCore\n" "0xb36\nARM1136\n"
    "0xb56\nARM1156\n"      "0xb76\nARM1176\n"      "0xc05\nCortex-A5\n"
    "0xc07\nCortex-A7\n"    "0xc08\nCortex-A8\n"    "0xc09\nCortex-A9\n"
    "0xc0d\nCortex-A17\n"   /* Originally A12 */
    "0xc0f\nCortex-A15\n"   "0xc0e\nCortex-A17\n"   "0xc14\nCortex-R4\n"
    "0xc15\nCortex-R5\n"    "0xc17\nCortex-R7\n"    "0xc18\nCortex-R8\n"
    "0xc20\nCortex-M0\n"    "0xc21\nCortex-M1\n"    "0xc23\nCortex-M3\n"
    "0xc24\nCortex-M4\n"    "0xc27\nCortex-M7\n"    "0xc60\nCortex-M0+\n"
    "0xd01\nCortex-A32\n"   "0xd03\nCortex-A53\n"   "0xd04\nCortex-A35\n"
    "0xd05\nCortex-A55\n"   "0xd06\nCortex-A65\n"   "0xd07\nCortex-A57\n"
    "0xd08\nCortex-A72\n"   "0xd09\nCortex-A73\n"   "0xd0a\nCortex-A75\n"
    "0xd0b\nCortex-A76\n"   "0xd0c\nNeoverse-N1\n"  "0xd0d\nCortex-A77\n"
    "0xd0e\nCortex-A76AE\n" "0xd13\nCortex-R52\n"   "0xd20\nCortex-M23\n"
    "0xd21\nCortex-M33\n"   "0xd41\nCortex-A78\n"   "0xd42\nCortex-A78AE\n"
    "0xd4a\nNeoverse-E1\n"  "0xd4b\nCortex-A78C\n"
#endif
    "";
  struct cpu {
    unsigned long long freq, user, nice, sys, idle, irq;
    unsigned model;
  };
  FILE* fp;
  char* p;
  int found;
  int n;
  unsigned i;
  unsigned cpu;
  unsigned maxcpu;
  unsigned size;
  unsigned long long skip;
  struct cpu (*cpus)[8192];  /* Kernel maximum. */
  struct cpu* c;
  struct cpu t;
  char (*model)[64];
  unsigned char bitmap[ARRAY_SIZE(*cpus) / 8];
  /* Assumption: even big.LITTLE systems will have only a handful
   * of different CPU models. Most systems will just have one.
   */
  char models[8][64];
  char buf[1024];

  memset(bitmap, 0, sizeof(bitmap));
  memset(models, 0, sizeof(models));
  snprintf(*models, sizeof(*models), "unknown");
  maxcpu = 0;

  cpus = uv__calloc(ARRAY_SIZE(*cpus), sizeof(**cpus));
  if (cpus == NULL)
    return UV_ENOMEM;

  fp = uv__open_file("/proc/stat");
  if (fp == NULL) {
    uv__free(cpus);
    return UV__ERR(errno);
  }

  if (NULL == fgets(buf, sizeof(buf), fp))
    abort();

  for (;;) {
    memset(&t, 0, sizeof(t));

    n = fscanf(fp, "cpu%u %llu %llu %llu %llu %llu %llu",
               &cpu, &t.user, &t.nice, &t.sys, &t.idle, &skip, &t.irq);

    if (n != 7)
      break;

    if (NULL == fgets(buf, sizeof(buf), fp))
      abort();

    if (cpu >= ARRAY_SIZE(*cpus))
      continue;

    (*cpus)[cpu] = t;

    bitmap[cpu >> 3] |= 1 << (cpu & 7);

    if (cpu >= maxcpu)
      maxcpu = cpu + 1;
  }

  fclose(fp);

  fp = uv__open_file("/proc/cpuinfo");
  if (fp == NULL)
    goto nocpuinfo;

  for (;;) {
    if (1 != fscanf(fp, "processor\t: %u\n", &cpu))
      break;  /* Parse error. */

    found = 0;
    while (!found && fgets(buf, sizeof(buf), fp))
      found = !strncmp(buf, model_marker, sizeof(model_marker) - 1);

    if (!found)
      goto next;

    p = buf + sizeof(model_marker) - 1;
    n = (int) strcspn(p, "\n");

    /* arm64: translate CPU part code to model name. */
    if (*parts) {
      p = memmem(parts, sizeof(parts) - 1, p, n + 1);
      if (p == NULL)
        p = "unknown";
      else
        p += n + 1;
      n = (int) strcspn(p, "\n");
    }

    found = 0;
    for (model = models; !found && model < ARRAY_END(models); model++)
      found = !strncmp(p, *model, strlen(*model));

    if (!found)
      goto next;

    if (**model == '\0')
      snprintf(*model, sizeof(*model), "%.*s", n, p);

    if (cpu < maxcpu)
      (*cpus)[cpu].model = model - models;

next:
    while (fgets(buf, sizeof(buf), fp))
      if (*buf == '\n')
        break;
  }

  fclose(fp);
  fp = NULL;

nocpuinfo:

  n = 0;
  for (cpu = 0; cpu < maxcpu; cpu++) {
    if (!(bitmap[cpu >> 3] & (1 << (cpu & 7))))
      continue;

    n++;
    snprintf(buf, sizeof(buf),
             "/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq", cpu);

    fp = uv__open_file(buf);
    if (fp == NULL)
      continue;

    if (1 != fscanf(fp, "%llu", &(*cpus)[cpu].freq))
      abort();
    fclose(fp);
    fp = NULL;
  }

  size = n * sizeof(**ci) + sizeof(models);
  *ci = uv__malloc(size);
  *count = 0;

  if (*ci == NULL) {
    uv__free(cpus);
    return UV_ENOMEM;
  }

  *count = n;
  p = memcpy(*ci + n, models, sizeof(models));

  i = 0;
  for (cpu = 0; cpu < maxcpu; cpu++) {
    if (!(bitmap[cpu >> 3] & (1 << (cpu & 7))))
      continue;

    c = *cpus + cpu;

    (*ci)[i++] = (uv_cpu_info_t) {
      .model     = p + c->model * sizeof(*model),
      .speed     = c->freq / 1000,
      /* Note: sysconf(_SC_CLK_TCK) is fixed at 100 Hz,
       * therefore the multiplier is always 1000/100 = 10.
       */
      .cpu_times = (struct uv_cpu_times_s) {
        .user = 10 * c->user,
        .nice = 10 * c->nice,
        .sys  = 10 * c->sys,
        .idle = 10 * c->idle,
        .irq  = 10 * c->irq,
      },
    };
  }

  uv__free(cpus);

  return 0;
}